

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

String * __thiscall
Json::valueToQuotedStringN_abi_cxx11_
          (String *__return_storage_ptr__,Json *this,char *value,size_t length,bool emitUTF8)

{
  _Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0> _Var1;
  bool bVar2;
  long lVar3;
  Json *__it;
  Json *this_00;
  _Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0> *p_Var4;
  uint uVar5;
  uint uVar6;
  uint ch;
  allocator<char> local_81;
  _Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0> *local_80;
  char *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this == (Json *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_70);
    return __return_storage_ptr__;
  }
  local_80 = (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0> *)
             (this + (long)value);
  __it = this;
  this_00 = this;
  local_78 = value;
  for (lVar3 = (long)value >> 2;
      p_Var4 = (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0> *)
               this_00, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::$_0>::operator()
                      ((_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                        *)this_00,(char *)__it);
    if (bVar2) goto LAB_0047d47b;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::$_0>::operator()
                      ((_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                        *)this_00 + 1,(char *)__it);
    p_Var4 = (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0> *)this_00
             + 1;
    if (bVar2) goto LAB_0047d47b;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::$_0>::operator()
                      ((_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                        *)this_00 + 2,(char *)__it);
    p_Var4 = (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0> *)this_00
             + 2;
    if (bVar2) goto LAB_0047d47b;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::$_0>::operator()
                      ((_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                        *)this_00 + 3,(char *)__it);
    p_Var4 = (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0> *)this_00
             + 3;
    if (bVar2) goto LAB_0047d47b;
    this_00 = (Json *)((_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                        *)this_00 + 4);
    value = value + -4;
  }
  if (value == (char *)0x1) {
LAB_0047d70b:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::$_0>::operator()
                      ((_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                        *)this_00,(char *)__it);
    p_Var4 = (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0> *)this_00
    ;
    if (!bVar2) goto LAB_0047d71e;
  }
  else if (value == (char *)0x2) {
LAB_0047d460:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::$_0>::operator()
                      ((_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                        *)this_00,(char *)__it);
    p_Var4 = (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0> *)this_00
    ;
    if (!bVar2) {
      this_00 = (Json *)((_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                          *)this_00 + 1);
      goto LAB_0047d70b;
    }
  }
  else {
    if (value != (char *)0x3) goto LAB_0047d71e;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::$_0>::operator()
                      ((_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                        *)this_00,(char *)__it);
    if (!bVar2) {
      this_00 = (Json *)((_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                          *)this_00 + 1);
      goto LAB_0047d460;
    }
  }
LAB_0047d47b:
  if (p_Var4 != local_80) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    do {
      if (this == (Json *)local_80) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      _Var1 = *(_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0> *)this;
      ch = (uint)(byte)_Var1;
      p_Var4 = (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0> *)this;
      switch(_Var1) {
      case (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>)0x8:
        break;
      case (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>)0x9:
        break;
      case (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>)0xa:
        break;
      case (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>)0xb:
switchD_0047d4e8_caseD_b:
        uVar5 = (uint)(byte)_Var1;
        if ((char)length == '\0') {
          if ((char)_Var1 < '\0') {
            if ((byte)_Var1 < 0xe0) {
              ch = 0xfffd;
              if (1 < (long)local_80 - (long)this) {
                uVar5 = (uVar5 & 0x1f) << 6;
                p_Var4 = (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                          *)this + 1;
                if (0x7f < uVar5) {
                  ch = uVar5 | (byte)((_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                                       *)this)[1] & 0x3f;
                  goto LAB_0047d55a;
                }
              }
            }
            else if ((byte)_Var1 < 0xf0) {
              ch = 0xfffd;
              if (2 < (long)local_80 - (long)this) {
                uVar5 = ((byte)_Var1 & 0xf) << 0xc;
                uVar6 = ((byte)((_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                                 *)this)[1] & 0x3f) << 6 | uVar5;
                p_Var4 = (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                          *)this + 2;
                if (((0xdfff < uVar5) || (uVar6 < 0xd800)) && (0x7ff < uVar6)) {
                  ch = uVar6 | (byte)*p_Var4 & 0x3f;
                  goto LAB_0047d55a;
                }
              }
            }
            else {
              ch = 0xfffd;
              if (3 < (long)local_80 - (long)this && (byte)_Var1 < 0xf8) {
                uVar5 = ((byte)((_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                                 *)this)[1] & 0x3f) << 0xc | (uVar5 & 7) << 0x12;
                p_Var4 = (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                          *)this + 3;
                if (0xffff < uVar5) {
                  ch = (byte)((_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                               *)this)[3] & 0x3f |
                       ((byte)((_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>
                                *)this)[2] & 0x3f) << 6 | uVar5;
                  goto LAB_0047d55a;
                }
              }
            }
LAB_0047d67f:
            appendHex(__return_storage_ptr__,ch);
          }
          else {
LAB_0047d55a:
            if (0x1f < ch) {
              if (ch < 0x80) {
                std::__cxx11::string::push_back((char)__return_storage_ptr__);
                goto LAB_0047d54d;
              }
              if (ch < 0x10000) goto LAB_0047d67f;
              appendHex(__return_storage_ptr__,ch + 0xf0000 >> 10 & 0x3ff | 0xd800);
              ch = ch & 0x3ff | 0xdc00;
            }
            appendHex(__return_storage_ptr__,ch);
          }
        }
        else if ((byte)_Var1 < 0x20) {
          appendHex(__return_storage_ptr__,uVar5);
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        goto LAB_0047d54d;
      case (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>)0xc:
        break;
      case (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>)0xd:
        break;
      default:
        if ((_Var1 != (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>)
                      0x5c) &&
           (_Var1 != (_Iter_pred<Json::doesAnyCharRequireEscaping(char_const*,unsigned_long)::__0>)
                     0x22)) goto switchD_0047d4e8_caseD_b;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_0047d54d:
      this = (Json *)(p_Var4 + 1);
    } while( true );
  }
LAB_0047d71e:
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\"",&local_81);
  std::operator+(&local_70,&local_50,(char *)this);
  std::operator+(__return_storage_ptr__,&local_70,"\"");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

static String valueToQuotedStringN(const char* value, size_t length,
                                   bool emitUTF8 = false) {
  if (value == nullptr)
    return "";

  if (!doesAnyCharRequireEscaping(value, length))
    return String("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to String is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  String::size_type maxsize = length * 2 + 3; // allescaped+quotes+NULL
  String result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  char const* end = value + length;
  for (const char* c = value; c != end; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.)
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default: {
      if (emitUTF8) {
        unsigned codepoint = static_cast<unsigned char>(*c);
        if (codepoint < 0x20) {
          appendHex(result, codepoint);
        } else {
          appendRaw(result, codepoint);
        }
      } else {
        unsigned codepoint = utf8ToCodepoint(c, end); // modifies `c`
        if (codepoint < 0x20) {
          appendHex(result, codepoint);
        } else if (codepoint < 0x80) {
          appendRaw(result, codepoint);
        } else if (codepoint < 0x10000) {
          // Basic Multilingual Plane
          appendHex(result, codepoint);
        } else {
          // Extended Unicode. Encode 20 bits as a surrogate pair.
          codepoint -= 0x10000;
          appendHex(result, 0xd800 + ((codepoint >> 10) & 0x3ff));
          appendHex(result, 0xdc00 + (codepoint & 0x3ff));
        }
      }
    } break;
    }
  }
  result += "\"";
  return result;
}